

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

bool __thiscall
Reducer::tryToEmptyFunctions(Reducer *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *names)

{
  value_type pEVar1;
  bool bVar2;
  reference pNVar3;
  pointer pBVar4;
  Expression *pEVar5;
  ostream *poVar6;
  size_type sVar7;
  reference ppEVar8;
  pointer pMVar9;
  reference pvVar10;
  long lVar11;
  Name NVar12;
  Name NVar13;
  ulong local_c0;
  size_t i;
  Type local_b0;
  undefined1 local_a1;
  Expression *pEStack_a0;
  bool useUnreachable;
  Expression *oldBody;
  Function *local_88;
  size_t sStack_80;
  Function *local_70;
  Function *func;
  Name name;
  iterator __end1;
  iterator __begin1;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range1;
  size_t actuallyEmptied;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> oldBodies;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *names_local;
  Reducer *this_local;
  
  oldBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)names;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&actuallyEmptied);
  __range1 = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)0x0;
  __end1 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(names);
  name.super_IString.str._M_str =
       (char *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end(names);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                     *)&name.super_IString.str._M_str), bVar2) {
    pNVar3 = __gnu_cxx::
             __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
             ::operator*(&__end1);
    func = (Function *)(pNVar3->super_IString).str._M_len;
    name.super_IString.str._M_len = (size_t)(pNVar3->super_IString).str._M_str;
    pMVar9 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                       (&this->module);
    local_88 = func;
    sStack_80 = name.super_IString.str._M_len;
    NVar12.super_IString.str._M_str = (char *)func;
    NVar12.super_IString.str._M_len = (size_t)pMVar9;
    local_70 = (Function *)wasm::Module::getFunction(NVar12);
    pEStack_a0 = local_70->body;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&actuallyEmptied,
               &stack0xffffffffffffff60);
    bVar2 = wasm::Importable::imported(&local_70->super_Importable);
    if (((!bVar2) && (bVar2 = wasm::Expression::is<wasm::Unreachable>(pEStack_a0), !bVar2)) &&
       (bVar2 = wasm::Expression::is<wasm::Nop>(pEStack_a0), !bVar2)) {
      __range1 = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                 ((long)&(__range1->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1);
      local_b0 = wasm::Function::getResults(local_70);
      i._4_4_ = 0;
      local_a1 = wasm::Type::operator!=(&local_b0,(BasicType *)((long)&i + 4));
      if ((bool)local_a1) {
        pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                           (&this->builder);
        pEVar5 = (Expression *)wasm::Builder::makeUnreachable(pBVar4);
        local_70->body = pEVar5;
      }
      else {
        pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                           (&this->builder);
        pEVar5 = (Expression *)wasm::Builder::makeNop(pBVar4);
        local_70->body = pEVar5;
      }
    }
    __gnu_cxx::
    __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
    operator++(&__end1);
  }
  if ((__range1 == (vector<wasm::Name,_std::allocator<wasm::Name>_> *)0x0) ||
     (bVar2 = writeAndTestReduction(this), !bVar2)) {
    for (local_c0 = 0; sVar7 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(names),
        local_c0 < sVar7; local_c0 = local_c0 + 1) {
      ppEVar8 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &actuallyEmptied,local_c0);
      pEVar1 = *ppEVar8;
      pMVar9 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                         (&this->module);
      pvVar10 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[](names,local_c0);
      NVar13.super_IString.str._M_str = (char *)(pvVar10->super_IString).str._M_len;
      NVar13.super_IString.str._M_len = (size_t)pMVar9;
      lVar11 = wasm::Module::getFunction(NVar13);
      *(value_type *)(lVar11 + 0x60) = pEVar1;
    }
    this_local._7_1_ = false;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"|        emptied ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)__range1);
    poVar6 = std::operator<<(poVar6," / ");
    sVar7 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(names);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
    std::operator<<(poVar6," functions\n");
    this_local._7_1_ = true;
  }
  i._0_4_ = 1;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&actuallyEmptied);
  return this_local._7_1_;
}

Assistant:

bool tryToEmptyFunctions(std::vector<Name> names) {
    std::vector<Expression*> oldBodies;
    size_t actuallyEmptied = 0;
    for (auto name : names) {
      auto* func = module->getFunction(name);
      auto* oldBody = func->body;
      oldBodies.push_back(oldBody);
      // Nothing to do for imported functions (body is nullptr) or for bodies
      // that have already been as reduced as we can make them.
      if (func->imported() || oldBody->is<Unreachable>() ||
          oldBody->is<Nop>()) {
        continue;
      }
      actuallyEmptied++;
      bool useUnreachable = func->getResults() != Type::none;
      if (useUnreachable) {
        func->body = builder->makeUnreachable();
      } else {
        func->body = builder->makeNop();
      }
    }
    if (actuallyEmptied > 0 && writeAndTestReduction()) {
      std::cerr << "|        emptied " << actuallyEmptied << " / "
                << names.size() << " functions\n";
      return true;
    } else {
      // Restore the bodies.
      for (size_t i = 0; i < names.size(); i++) {
        module->getFunction(names[i])->body = oldBodies[i];
      }
      return false;
    }
  }